

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_doz(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGLabel *l;
  TCGLabel *a1;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_ppc64(s);
  a1 = gen_new_label_ppc64(s);
  tcg_gen_brcond_i64_ppc64
            (s,TCG_COND_GE,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),l);
  uVar1 = ctx->opcode;
  tcg_gen_sub_i64(s,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)),
                  *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8)),
                  *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8)));
  *(short *)&a1->field_0x2 = (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
  tcg_gen_op1_ppc64(s,INDEX_op_br,(TCGArg)a1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)l);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,
                    (long)&s->pool_cur +
                    *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0);
  *(byte *)a1 = *(byte *)a1 | 1;
  tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)a1);
  if ((ctx->opcode & 1) != 0) {
    gen_doz_cold_1();
  }
  return;
}

Assistant:

static void gen_doz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_GE, cpu_gpr[rB(ctx->opcode)],
                      cpu_gpr[rA(ctx->opcode)], l1);
    tcg_gen_sub_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], cpu_gpr[rB(ctx->opcode)],
                   cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], 0);
    gen_set_label(tcg_ctx, l2);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}